

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O2

bool redit_show(CHAR_DATA *ch,char *argument)

{
  char cVar1;
  short sVar2;
  TRAP_DATA *pTVar3;
  CHAR_DATA *pCVar4;
  OBJ_DATA *pOVar5;
  EXIT_DATA *pEVar6;
  bool bVar7;
  char *pcVar8;
  size_t sVar9;
  ulong uVar10;
  ulong uVar11;
  char cVar12;
  OBJ_DATA **ppOVar13;
  EXTRA_DESCR_DATA *ed;
  EXTRA_DESCR_DATA *pEVar14;
  ROOM_INDEX_DATA *pRVar15;
  CHAR_DATA **ppCVar16;
  long lVar17;
  ROOM_INDEX_DATA *pRVar18;
  char *local_5a48;
  char *local_5a40;
  char buf1 [9216];
  char buf [4608];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> buffer;
  char reset_state [4608];
  
  pRVar15 = ch->in_room;
  buf1[0] = '\0';
  sprintf(buf,"Description:\n\r%s",pRVar15->description);
  strcat(buf1,buf);
  if (pRVar15->alt_description == (char *)0x0) {
    sVar9 = strlen(buf1);
    builtin_strncpy(buf1 + sVar9,"Alt Desc:   [None]\n\r",0x15);
  }
  else {
    sprintf(buf,"Alt Desc:\n\r%sAlternate Room Title is %s.\n\rDescription is %s.\n\r",
            pRVar15->alt_description,pRVar15->alt_name,
            altdesc_condtable[pRVar15->alt_description_cond].display);
    strcat(buf1,buf);
  }
  sprintf(buf,"Name:       [%s]\n\rArea:       [%5d] %s\n\r",pRVar15->name,
          (ulong)(uint)pRVar15->area->vnum,pRVar15->area->name);
  strcat(buf1,buf);
  sVar2 = pRVar15->vnum;
  pcVar8 = flag_string_old(sector_flags,(int)pRVar15->sector_type);
  sprintf(buf,"Vnum:       [%5d]\n\rSector:     [%s]\n\r",(ulong)(uint)(int)sVar2,pcVar8);
  strcat(buf1,buf);
  sprintf(buf,"Cabal:      [%s]\n\r",cabal_table[pRVar15->cabal].name);
  strcat(buf1,buf);
  pcVar8 = pRVar15->owner;
  if (pcVar8 == (char *)0x0) {
    pcVar8 = "None";
  }
  sprintf(buf,"Owner:      [%s]\n\r",pcVar8);
  strcat(buf1,buf);
  pcVar8 = flag_string(room_flags,pRVar15->room_flags);
  sprintf(buf,"Room flags: [%s]\n\r",pcVar8);
  strcat(buf1,buf);
  sprintf(buf,"Health recovery:[%d]\n\rMana recovery  :[%d]\n\r",
          (ulong)(uint)(int)pRVar15->heal_rate,(ulong)(uint)(int)pRVar15->mana_rate);
  strcat(buf1,buf);
  pRVar18 = pRVar15;
  sVar9 = strlen(buf1);
  builtin_strncpy(buf1 + sVar9,"Trap:",6);
  if (pRVar15->trap == (TRAP_DATA *)0x0) {
    sVar9 = strlen(buf1);
    builtin_strncpy(buf1 + sVar9,"       [None]\n\r",0x10);
  }
  else {
    reset_state._0_8_ = flag_name_lookup((long)pRVar15->trap->type,trap_table);
    pTVar3 = pRVar15->trap;
    local_5a40 = pTVar3->trig_echo;
    if (local_5a40 == (char *)0x0) {
      local_5a40 = "None";
    }
    local_5a48 = pTVar3->exec_echo;
    if (local_5a48 == (char *)0x0) {
      local_5a48 = "None";
    }
    fmt::v9::sprintf<char[145],char*,int,int,int,char_const*,char_const*,char>
              (&buffer,(v9 *)
                       "\n\r Type:          [%s]\n\r Quality:       [%2d]\n\r Complexity:    [%3d]\n\r Timer:         [%d seconds]\n\r Trigger Echo:  [%s]\n\r Execute Echo:  [%s]\n\r"
               ,(char (*) [145])reset_state,(char **)&pTVar3->quality,&pTVar3->complexity,
               &pTVar3->timer,(int *)&local_5a40,&local_5a48,(char **)pRVar18);
    strcat(buf1,(char *)CONCAT71(buffer._M_dataplus._M_p._1_7_,(char)buffer._M_dataplus._M_p));
    std::__cxx11::string::~string((string *)&buffer);
  }
  send_to_char(buf1,ch);
  buf1[0] = '\0';
  bVar7 = IS_ZERO_VECTOR(pRVar15->progtypes);
  if (!bVar7) {
    send_to_char("Room Programs:\n\r",ch);
    uVar10 = pRVar15->progtypes[0];
    if ((uVar10 & 1) != 0) {
      sprintf(buf," [pulse_prog] %s\n\r",pRVar15->rprogs->pulse_name);
      send_to_char(buf,ch);
      uVar10 = pRVar15->progtypes[0];
    }
    if ((uVar10 & 2) != 0) {
      sprintf(buf," [entry_prog] %s\n\r",pRVar15->rprogs->entry_name);
      send_to_char(buf,ch);
      uVar10 = pRVar15->progtypes[0];
    }
    if ((uVar10 & 4) != 0) {
      sprintf(buf," [move_prog] %s\n\r",pRVar15->rprogs->move_name);
      send_to_char(buf,ch);
      uVar10 = pRVar15->progtypes[0];
    }
    if ((uVar10 & 8) != 0) {
      sprintf(buf," [drop_prog] %s\n\r",pRVar15->rprogs->drop_name);
      send_to_char(buf,ch);
      uVar10 = pRVar15->progtypes[0];
    }
    if ((uVar10 & 0x10) != 0) {
      sprintf(buf," [speech_prog] %s\n\r",pRVar15->rprogs->speech_name);
      send_to_char(buf,ch);
      uVar10 = pRVar15->progtypes[0];
    }
    if ((uVar10 & 0x20) != 0) {
      sprintf(buf," [open_prog] %s\n\r",pRVar15->rprogs->open_name);
      send_to_char(buf,ch);
    }
  }
  sVar9 = strlen(buf1);
  builtin_strncpy(buf1 + sVar9,"Characters: [",0xe);
  bVar7 = false;
  ppCVar16 = &pRVar15->people;
  while (pCVar4 = *ppCVar16, pCVar4 != (CHAR_DATA *)0x0) {
    one_argument(pCVar4->name,buf);
    strcat(buf1,buf);
    sVar9 = strlen(buf1);
    (buf1 + sVar9)[0] = ' ';
    (buf1 + sVar9)[1] = '\0';
    bVar7 = true;
    ppCVar16 = &pCVar4->next_in_room;
  }
  if (bVar7) {
    sVar9 = strlen(buf1);
    buf1[(long)((sVar9 << 0x20) + -0x100000000) >> 0x20] = ']';
    sVar9 = strlen(buf1);
    (buf1 + sVar9)[0] = '\n';
    (buf1 + sVar9)[1] = '\r';
    buf1[sVar9 + 2] = '\0';
  }
  else {
    sVar9 = strlen(buf1);
    builtin_strncpy(buf1 + sVar9,"none]\n\r",8);
  }
  pRVar15 = pRVar18;
  sVar9 = strlen(buf1);
  builtin_strncpy(buf1 + sVar9,"Objects:    [",0xe);
  bVar7 = false;
  ppOVar13 = &pRVar18->contents;
  while (pOVar5 = *ppOVar13, pOVar5 != (OBJ_DATA *)0x0) {
    one_argument(pOVar5->name,buf);
    strcat(buf1,buf);
    sVar9 = strlen(buf1);
    (buf1 + sVar9)[0] = ' ';
    (buf1 + sVar9)[1] = '\0';
    bVar7 = true;
    ppOVar13 = &pOVar5->next_content;
  }
  if (bVar7) {
    sVar9 = strlen(buf1);
    buf1[(long)((sVar9 << 0x20) + -0x100000000) >> 0x20] = ']';
    sVar9 = strlen(buf1);
    (buf1 + sVar9)[0] = '\n';
    (buf1 + sVar9)[1] = '\r';
    buf1[sVar9 + 2] = '\0';
  }
  else {
    sVar9 = strlen(buf1);
    builtin_strncpy(buf1 + sVar9,"none]\n\r",8);
  }
  pEVar14 = pRVar15->extra_descr;
  if (pEVar14 != (EXTRA_DESCR_DATA *)0x0) {
    for (; pEVar14 != (EXTRA_DESCR_DATA *)0x0; pEVar14 = pEVar14->next) {
      sVar9 = strlen(buf1);
      builtin_strncpy(buf1 + sVar9,"Extra Desc Keyword: ",0x15);
      strcat(buf1,pEVar14->keyword);
      sVar9 = strlen(buf1);
      (buf1 + sVar9)[0] = '\n';
      (buf1 + sVar9)[1] = '\r';
      buf1[sVar9 + 2] = '\0';
    }
  }
  pRVar18 = pRVar15;
  for (lVar17 = 0; lVar17 != 6; lVar17 = lVar17 + 1) {
    pEVar6 = pRVar15->exit[lVar17];
    if (pEVar6 != (EXIT_DATA *)0x0) {
      pcVar8 = capitalize(dir_name[lVar17]);
      if ((pEVar6->u1).to_room == (ROOM_INDEX_DATA *)0x0) {
        uVar10 = 0;
      }
      else {
        uVar10 = (ulong)(uint)(int)((pEVar6->u1).to_room)->vnum;
      }
      sprintf(buf,"-%-5s to [%5d] Key: [%5d] ",pcVar8,uVar10,(ulong)(uint)(int)pEVar6->key);
      strcat(buf1,buf);
      pcVar8 = flag_string(exit_flags,pEVar6->exit_info);
      sVar9 = strlen(buf1);
      builtin_strncpy(buf1 + sVar9," Exit flags: [",0xf);
      pRVar15 = pRVar18;
      while( true ) {
        pcVar8 = one_argument(pcVar8,(char *)&buffer);
        if ((char)buffer._M_dataplus._M_p == '\0') break;
        bVar7 = str_infix((char *)&buffer,reset_state);
        if (bVar7) {
          sVar9 = strlen((char *)&buffer);
          uVar10 = sVar9 & 0xffffffff;
          if ((int)sVar9 < 1) {
            uVar10 = 0;
          }
          for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 1) {
            cVar1 = *(char *)((long)&buffer._M_dataplus._M_p + uVar11);
            cVar12 = cVar1 + -0x20;
            if (0x19 < (byte)(cVar1 + 0x9fU)) {
              cVar12 = cVar1;
            }
            *(char *)((long)&buffer._M_dataplus._M_p + uVar11) = cVar12;
          }
        }
        strcat(buf1,(char *)&buffer);
        sVar9 = strlen(buf1);
        (buf1 + sVar9)[0] = ' ';
        (buf1 + sVar9)[1] = '\0';
      }
      sVar9 = strlen(buf1);
      buf1[(long)((sVar9 << 0x20) + -0x100000000) >> 0x20] = ']';
      sVar9 = strlen(buf1);
      (buf1 + sVar9)[0] = '\n';
      (buf1 + sVar9)[1] = '\r';
      buf1[sVar9 + 2] = '\0';
      if ((pEVar6->keyword != (char *)0x0) && (*pEVar6->keyword != '\0')) {
        sprintf(buf,"Kwds: [%s]\n\r");
        strcat(buf1,buf);
      }
      pcVar8 = pEVar6->description;
      pRVar18 = pRVar15;
      if ((pcVar8 != (char *)0x0) && (*pcVar8 != '\0')) {
        strcpy(buf,pcVar8);
        strcat(buf1,buf);
      }
    }
  }
  send_to_char(buf1,ch);
  send_to_char("Syntax:  resets\n\r---- RESETS ----\n\r",ch);
  do_resets(ch,"");
  return false;
}

Assistant:

bool redit_show(CHAR_DATA *ch, char *argument)
{
	ROOM_INDEX_DATA *pRoom;
	char buf[MAX_STRING_LENGTH];
	char buf1[2 * MAX_STRING_LENGTH];
	OBJ_DATA *obj;
	CHAR_DATA *rch;
	int door;
	bool fcnt;

	EDIT_ROOM(ch, pRoom);

	buf1[0] = '\0';

	sprintf(buf, "Description:\n\r%s", pRoom->description);
	strcat(buf1, buf);

	if (pRoom->alt_description)
	{
		sprintf(buf, "Alt Desc:\n\r%sAlternate Room Title is %s.\n\rDescription is %s.\n\r",
			pRoom->alt_description,
			pRoom->alt_name,
			altdesc_condtable[pRoom->alt_description_cond].display);
		strcat(buf1, buf);
	}
	else
		strcat(buf1, "Alt Desc:   [None]\n\r");

	sprintf(buf, "Name:       [%s]\n\rArea:       [%5d] %s\n\r",
		pRoom->name,
		pRoom->area->vnum,
		pRoom->area->name);
	strcat(buf1, buf);

	sprintf(buf, "Vnum:       [%5d]\n\rSector:     [%s]\n\r",
		pRoom->vnum,
		flag_string_old(sector_flags, pRoom->sector_type));
	strcat(buf1, buf);

	sprintf(buf, "Cabal:      [%s]\n\r", cabal_table[pRoom->cabal].name);
	strcat(buf1, buf);

	sprintf(buf, "Owner:      [%s]\n\r", (pRoom->owner) ? pRoom->owner : "None");
	strcat(buf1, buf);

	sprintf(buf, "Room flags: [%s]\n\r", flag_string(room_flags, pRoom->room_flags));
	strcat(buf1, buf);

	sprintf(buf, "Health recovery:[%d]\n\rMana recovery  :[%d]\n\r", pRoom->heal_rate, pRoom->mana_rate);
	strcat(buf1, buf);

	strcat(buf1, "Trap:");

	if (pRoom->trap)
	{
		auto buffer = 
			fmt::sprintf("\n\r Type:          [%s]\n\r Quality:       [%2d]\n\r Complexity:    [%3d]\n\r Timer:         [%d seconds]\n\r Trigger Echo:  [%s]\n\r Execute Echo:  [%s]\n\r",
				flag_name_lookup(pRoom->trap->type, trap_table),
				pRoom->trap->quality,
				pRoom->trap->complexity,
				pRoom->trap->timer,
				(pRoom->trap->trig_echo != nullptr) ? pRoom->trap->trig_echo : "None",
				(pRoom->trap->exec_echo != nullptr) ? pRoom->trap->exec_echo : "None"); //TODO: change the rest of the sprintf calls to format

		strcat(buf1, buffer.data());
	}
	else
	{
		strcat(buf1, "       [None]\n\r");
	}

	send_to_char(buf1, ch);
	buf1[0] = '\0';

	if (!IS_ZERO_VECTOR(pRoom->progtypes))
	{
		send_to_char("Room Programs:\n\r", ch);
		if (IS_SET(pRoom->progtypes, RPROG_PULSE))
		{
			sprintf(buf, " [pulse_prog] %s\n\r", pRoom->rprogs->pulse_name);
			send_to_char(buf, ch);
		}

		if (IS_SET(pRoom->progtypes, RPROG_ENTRY))
		{
			sprintf(buf, " [entry_prog] %s\n\r", pRoom->rprogs->entry_name);
			send_to_char(buf, ch);
		}

		if (IS_SET(pRoom->progtypes, RPROG_MOVE))
		{
			sprintf(buf, " [move_prog] %s\n\r", pRoom->rprogs->move_name);
			send_to_char(buf, ch);
		}

		if (IS_SET(pRoom->progtypes, RPROG_DROP))
		{
			sprintf(buf, " [drop_prog] %s\n\r", pRoom->rprogs->drop_name);
			send_to_char(buf, ch);
		}

		if (IS_SET(pRoom->progtypes, RPROG_SPEECH))
		{
			sprintf(buf, " [speech_prog] %s\n\r", pRoom->rprogs->speech_name);
			send_to_char(buf, ch);
		}

		if (IS_SET(pRoom->progtypes, RPROG_OPEN))
		{
			sprintf(buf, " [open_prog] %s\n\r", pRoom->rprogs->open_name);
			send_to_char(buf, ch);
		}
	}

	strcat(buf1, "Characters: [");
	fcnt = false;

	for (rch = pRoom->people; rch; rch = rch->next_in_room)
	{
		one_argument(rch->name, buf);
		strcat(buf1, buf);
		strcat(buf1, " ");
		fcnt = true;
	}

	if (fcnt)
	{
		int end = strlen(buf1) - 1;
		buf1[end] = ']';
		strcat(buf1, "\n\r");
	}
	else
	{
		strcat(buf1, "none]\n\r");
	}

	strcat(buf1, "Objects:    [");
	fcnt = false;

	for (obj = pRoom->contents; obj; obj = obj->next_content)
	{
		one_argument(obj->name, buf);
		strcat(buf1, buf);
		strcat(buf1, " ");
		fcnt = true;
	}

	if (fcnt)
	{
		int end = strlen(buf1) - 1;
		buf1[end] = ']';
		strcat(buf1, "\n\r");
	}
	else
	{
		strcat(buf1, "none]\n\r");
	}

	if (pRoom->extra_descr)
	{
		for (EXTRA_DESCR_DATA *ed = pRoom->extra_descr; ed; ed = ed->next)
		{
			strcat(buf1, "Extra Desc Keyword: ");
			strcat(buf1, ed->keyword);
			strcat(buf1, "\n\r");
		}
	}

	for (door = 0; door < MAX_DIR; door++)
	{
		EXIT_DATA *pexit = pRoom->exit[door];

		if (pexit != nullptr)
		{
			char word[MAX_INPUT_LENGTH];
			char reset_state[MAX_STRING_LENGTH];
			char *state;
			int i, length;

			sprintf(buf, "-%-5s to [%5d] Key: [%5d] ",
				capitalize(dir_name[door]),
				pexit->u1.to_room ? pexit->u1.to_room->vnum : 0, /* ROM OLC */
				pexit->key);
			strcat(buf1, buf);

			/*
			 * Format up the exit info.
			 * Capitalize all flags that are not part of the reset info.
			 */
			state = flag_string(exit_flags, pexit->exit_info);
			strcat(buf1, " Exit flags: [");

			for (;;)
			{
				state = one_argument(state, word);

				if (word[0] == '\0')
				{
					int end = strlen(buf1) - 1;
					buf1[end] = ']';
					strcat(buf1, "\n\r");
					break;
				}

				if (str_infix(word, reset_state))
				{
					length = strlen(word);

					for (i = 0; i < length; i++)
					{
						word[i] = UPPER(word[i]);
					}
				}

				strcat(buf1, word);
				strcat(buf1, " ");
			}

			if (pexit->keyword && pexit->keyword[0] != '\0')
			{
				sprintf(buf, "Kwds: [%s]\n\r", pexit->keyword);
				strcat(buf1, buf);
			}

			if (pexit->description && pexit->description[0] != '\0')
			{
				sprintf(buf, "%s", pexit->description);
				strcat(buf1, buf);
			}
		}
	}

	send_to_char(buf1, ch);
	send_to_char("Syntax:  resets\n\r---- RESETS ----\n\r", ch);
	do_resets(ch, "");
	return false;
}